

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragScalar(char *label,ImGuiDataType data_type,void *v,float v_speed,void *v_min,
                      void *v_max,char *format,float power)

{
  float fVar1;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ImGuiID id_00;
  ImU32 fill_col;
  int iVar7;
  ImGuiWindow *this;
  ImGuiDataTypeInfo *pIVar8;
  float _x;
  ImGuiCol local_188;
  byte local_182;
  byte local_181;
  float local_174;
  ImVec2 local_140;
  ImVec2 local_138;
  char *local_130;
  char *value_buf_end;
  char value_buf [64];
  bool value_changed;
  ImU32 frame_col;
  bool double_clicked;
  bool clicked;
  bool focus_requested;
  bool temp_input_start;
  bool temp_input_is_active;
  bool hovered;
  ImVec2 local_b0;
  undefined1 local_a8 [8];
  ImRect total_bb;
  ImVec2 local_90;
  undefined1 local_88 [8];
  ImRect frame_bb;
  ImVec2 label_size;
  float w;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *pcStack_48;
  float power_local;
  char *format_local;
  void *v_max_local;
  void *v_min_local;
  float v_speed_local;
  void *v_local;
  ImGuiDataType data_type_local;
  char *label_local;
  
  this = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((this->SkipItems & 1U) == 0) {
    if (((power != 1.0) || (NAN(power))) && (v_min == (void *)0x0 || v_max == (void *)0x0)) {
      __assert_fail("v_min != __null && v_max != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                    ,0x7f6,
                    "bool ImGui::DragScalar(const char *, ImGuiDataType, void *, float, const void *, const void *, const char *, float)"
                   );
    }
    id_00 = ImGuiWindow::GetID(this,label,(char *)0x0);
    _x = CalcItemWidth();
    frame_bb.Max = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar1 = (pIVar2->Style).FramePadding.y;
    ImVec2::ImVec2(&total_bb.Max,_x,fVar1 + fVar1 + frame_bb.Max.y);
    local_90 = operator+(&(this->DC).CursorPos,&total_bb.Max);
    ImRect::ImRect((ImRect *)local_88,&(this->DC).CursorPos,&local_90);
    if (frame_bb.Max.x <= 0.0) {
      local_174 = 0.0;
    }
    else {
      local_174 = (pIVar2->Style).ItemInnerSpacing.x + frame_bb.Max.x;
    }
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff48,local_174,0.0);
    local_b0 = operator+(&frame_bb.Min,(ImVec2 *)&stack0xffffffffffffff48);
    ImRect::ImRect((ImRect *)local_a8,(ImVec2 *)local_88,&local_b0);
    ItemSize((ImRect *)local_a8,(pIVar2->Style).FramePadding.y);
    bVar3 = ItemAdd((ImRect *)local_a8,id_00,(ImRect *)local_88);
    if (bVar3) {
      if (format == (char *)0x0) {
        pIVar8 = DataTypeGetInfo(data_type);
        pcStack_48 = pIVar8->PrintFmt;
      }
      else {
        pcStack_48 = format;
        if ((data_type == 4) && (iVar7 = strcmp(format,"%d"), iVar7 != 0)) {
          pcStack_48 = PatchFormatStringFloatToInt(format);
        }
      }
      bVar4 = ItemHoverable((ImRect *)local_88,id_00);
      bVar5 = TempInputTextIsActive(id_00);
      bVar3 = false;
      if (!bVar5) {
        bVar6 = FocusableItemRegister(this,id_00);
        local_181 = 0;
        if (bVar4) {
          local_181 = (pIVar2->IO).MouseClicked[0];
        }
        local_182 = 0;
        if (bVar4) {
          local_182 = (pIVar2->IO).MouseDoubleClicked[0];
        }
        if (((bVar6) || ((local_181 & 1) != 0)) ||
           (((local_182 & 1) != 0 ||
            ((pIVar2->NavActivateId == id_00 || (pIVar2->NavInputId == id_00)))))) {
          SetActiveID(id_00,this);
          SetFocusID(id_00,this);
          FocusWindow(this);
          pIVar2->ActiveIdAllowNavDirFlags = 0xc;
          if ((bVar6) ||
             (((((local_181 & 1) != 0 && (((pIVar2->IO).KeyCtrl & 1U) != 0)) ||
               ((local_182 & 1) != 0)) || (pIVar2->NavInputId == id_00)))) {
            bVar3 = true;
            FocusableItemUnregister(this);
          }
        }
      }
      if ((bVar5) || (bVar3)) {
        label_local._7_1_ =
             TempInputTextScalar((ImRect *)local_88,id_00,label,data_type,v,pcStack_48);
      }
      else {
        if (pIVar2->ActiveId == id_00) {
          local_188 = 9;
        }
        else {
          local_188 = 7;
          if (pIVar2->HoveredId == id_00) {
            local_188 = 8;
          }
        }
        fill_col = GetColorU32(local_188,1.0);
        RenderNavHighlight((ImRect *)local_88,id_00,1);
        p_min.y = (float)local_88._4_4_;
        p_min.x = (float)local_88._0_4_;
        p_max.y = frame_bb.Min.y;
        p_max.x = frame_bb.Min.x;
        RenderFrame(p_min,p_max,fill_col,true,(pIVar2->Style).FrameRounding);
        label_local._7_1_ = DragBehavior(id_00,data_type,v,v_speed,v_min,v_max,pcStack_48,power,0);
        if (label_local._7_1_) {
          MarkItemEdited(id_00);
        }
        iVar7 = DataTypeFormatString((char *)&value_buf_end,0x40,data_type,v,pcStack_48);
        local_130 = value_buf + (long)iVar7 + -8;
        ImVec2::ImVec2(&local_138,0.5,0.5);
        RenderTextClipped((ImVec2 *)local_88,&frame_bb.Min,(char *)&value_buf_end,
                          value_buf + (long)iVar7 + -8,(ImVec2 *)0x0,&local_138,(ImRect *)0x0);
        if (0.0 < frame_bb.Max.x) {
          ImVec2::ImVec2(&local_140,frame_bb.Min.x + (pIVar2->Style).ItemInnerSpacing.x,
                         (float)local_88._4_4_ + (pIVar2->Style).FramePadding.y);
          RenderText(local_140,label,(char *)0x0,true);
        }
      }
    }
    else {
      label_local._7_1_ = false;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::DragScalar(const char* label, ImGuiDataType data_type, void* v, float v_speed, const void* v_min, const void* v_max, const char* format, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    if (power != 1.0f)
        IM_ASSERT(v_min != NULL && v_max != NULL); // When using a power curve the drag needs to have known bounds

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const float w = CalcItemWidth();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));

    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    // Default format string when passing NULL
    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;
    else if (data_type == ImGuiDataType_S32 && strcmp(format, "%d") != 0) // (FIXME-LEGACY: Patch old "%.0f" format string to use "%d", read function more details.)
        format = PatchFormatStringFloatToInt(format);

    // Tabbing or CTRL-clicking on Drag turns it into an input box
    const bool hovered = ItemHoverable(frame_bb, id);
    bool temp_input_is_active = TempInputTextIsActive(id);
    bool temp_input_start = false;
    if (!temp_input_is_active)
    {
        const bool focus_requested = FocusableItemRegister(window, id);
        const bool clicked = (hovered && g.IO.MouseClicked[0]);
        const bool double_clicked = (hovered && g.IO.MouseDoubleClicked[0]);
        if (focus_requested || clicked || double_clicked || g.NavActivateId == id || g.NavInputId == id)
        {
            SetActiveID(id, window);
            SetFocusID(id, window);
            FocusWindow(window);
            g.ActiveIdAllowNavDirFlags = (1 << ImGuiDir_Up) | (1 << ImGuiDir_Down);
            if (focus_requested || (clicked && g.IO.KeyCtrl) || double_clicked || g.NavInputId == id)
            {
                temp_input_start = true;
                FocusableItemUnregister(window);
            }
        }
    }
    if (temp_input_is_active || temp_input_start)
        return TempInputTextScalar(frame_bb, id, label, data_type, v, format);

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : g.HoveredId == id ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, style.FrameRounding);

    // Drag behavior
    const bool value_changed = DragBehavior(id, data_type, v, v_speed, v_min, v_max, format, power, ImGuiDragFlags_None);
    if (value_changed)
        MarkItemEdited(id);

    // Display value using user-provided display format so user can add prefix/suffix/decorations to the value.
    char value_buf[64];
    const char* value_buf_end = value_buf + DataTypeFormatString(value_buf, IM_ARRAYSIZE(value_buf), data_type, v, format);
    RenderTextClipped(frame_bb.Min, frame_bb.Max, value_buf, value_buf_end, NULL, ImVec2(0.5f, 0.5f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags);
    return value_changed;
}